

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_size_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  CURLcode CVar1;
  long size;
  char clbuf [128];
  char acStack_a8 [128];
  
  data = conn->data;
  size = -1;
  if (ftpcode == 0xd5) {
    size = strtol((data->state).buffer + 4,(char **)0x0,0);
  }
  if (instate != FTP_STOR_SIZE) {
    if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(data,size);
      CVar1 = ftp_state_retr(conn,size);
      return CVar1;
    }
    CVar1 = CURLE_OK;
    if (instate == FTP_SIZE) {
      if (size != -1) {
        curl_msnprintf(acStack_a8,0x80,"Content-Length: %ld\r\n");
        CVar1 = Curl_client_write(conn,3,acStack_a8,0);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
      }
      Curl_pgrsSetDownloadSize(data,size);
      CVar1 = ftp_state_rest(conn);
    }
    return CVar1;
  }
  (data->state).resume_from = size;
  CVar1 = ftp_state_ul_setup(conn,true);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_size_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data=conn->data;
  curl_off_t filesize;
  char *buf = data->state.buffer;

  /* get the size from the ascii string: */
  filesize = (ftpcode == 213)?curlx_strtoofft(buf+4, NULL, 0):-1;

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      snprintf(clbuf, sizeof(clbuf),
               "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, clbuf, 0);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(conn, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(conn, TRUE);
  }

  return result;
}